

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Connection::handlePRIORITY(QHttp2Connection *this)

{
  bool bVar1;
  quint32 streamID;
  char *message;
  Http2Error errorCode;
  long in_FS_OFFSET;
  uchar weight;
  uchar local_1d;
  quint32 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  streamID = Http2::Frame::streamID((Frame *)(this + 0x238));
  if (streamID == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      message = "PRIORITY on 0x0 stream";
      errorCode = PROTOCOL_ERROR;
LAB_001ea50b:
      connectionError(this,errorCode,message);
      return;
    }
  }
  else {
    bVar1 = isInvalidStream(this,streamID);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        message = "PRIORITY on invalid stream";
        errorCode = ENHANCE_YOUR_CALM;
        goto LAB_001ea50b;
      }
    }
    else {
      local_1c = 0;
      local_1d = '\0';
      Http2::Frame::priority((Frame *)(this + 0x238),&local_1c,&local_1d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handlePRIORITY()
{
    Q_ASSERT(inboundFrame.type() == FrameType::PRIORITY
             || inboundFrame.type() == FrameType::HEADERS);

    const auto streamID = inboundFrame.streamID();
    // RFC 9913, 6.3: If a PRIORITY frame is received with a stream identifier of 0x00, the
    // recipient MUST respond with a connection error
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "PRIORITY on 0x0 stream");

    // RFC 9113 6.4: After receiving a RST_STREAM on a stream, the receiver MUST NOT send
    // additional frames for that stream
    if (isInvalidStream(streamID))
        return connectionError(ENHANCE_YOUR_CALM, "PRIORITY on invalid stream");

    // RFC 9913, 6.3:  A PRIORITY frame with a length other than 5 octets MUST be treated as a
    // stream error (Section 5.4.2) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.type() != FrameType::PRIORITY || inboundFrame.payloadSize() == 5);

    quint32 streamDependency = 0;
    uchar weight = 0;
    const bool noErr = inboundFrame.priority(&streamDependency, &weight);
    Q_UNUSED(noErr);
    Q_ASSERT(noErr);

    const bool exclusive = streamDependency & 0x80000000;
    streamDependency &= ~0x80000000;

    // Ignore this for now ...
    // Can be used for streams (re)prioritization - 5.3
    Q_UNUSED(exclusive);
    Q_UNUSED(weight);
}